

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O3

void NativeCodeGenerator::LogCodeGenStart(CodeGenWorkItem *workItem,LARGE_INTEGER *start_time)

{
  byte bVar1;
  FunctionBody *this;
  FieldAccessStats *pFVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ULONG UVar7;
  undefined4 extraout_var;
  undefined4 *puVar8;
  undefined4 extraout_var_00;
  char16 *pcVar9;
  char *pcVar10;
  FunctionInfo *pFVar11;
  FunctionCodeGenJitTimeData *pFVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char16_t *form;
  wchar local_98 [4];
  char16 debugStringBuffer [42];
  Type stats;
  
  this = workItem->functionBody;
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,BackEndPhase);
  if (bVar4) {
    bVar1 = workItem->entryPointInfo->field_0x18;
    iVar5 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
    if ((bVar1 & 2) == 0) {
      Output::Print(L"---BeginBackEnd: function: %s---\r\n",CONCAT44(extraout_var,iVar5));
    }
    else {
      uVar6 = Js::FunctionBody::GetLoopNumberWithLock
                        (workItem->functionBody,
                         (LoopHeader *)
                         workItem[1].super_Job.
                         super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.previous
                        );
      Output::Print(L"---BeginBackEnd: function: %s, loop:%d---\r\n",CONCAT44(extraout_var,iVar5),
                    (ulong)uVar6);
    }
    Output::Flush();
  }
  uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  pFVar11 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar11 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_005f8553;
    *puVar8 = 0;
    pFVar11 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BackEndPhase,uVar6,pFVar11->functionId);
  if (bVar4) {
    QueryPerformanceCounter(start_time);
    bVar1 = workItem->entryPointInfo->field_0x18;
    iVar5 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
    pcVar9 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_98);
    UVar7 = Js::ParseableFunctionInfo::GetLineNumber(&this->super_ParseableFunctionInfo);
    if ((bVar1 & 2) == 0) {
      pcVar10 = ExecutionModeName((workItem->jitData).jitMode);
      Output::Print(L"BeginBackEnd - function: %s (%s, line %u), mode: %S",
                    CONCAT44(extraout_var_00,iVar5),pcVar9,(ulong)UVar7,pcVar10);
    }
    else {
      uVar6 = Js::FunctionBody::GetLoopNumberWithLock
                        (workItem->functionBody,
                         (LoopHeader *)
                         workItem[1].super_Job.
                         super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.previous
                        );
      pcVar10 = ExecutionModeName((workItem->jitData).jitMode);
      Output::Print(L"BeginBackEnd - function: %s (%s, line %u), loop: %u, mode: %S",
                    CONCAT44(extraout_var_00,iVar5),pcVar9,(ulong)UVar7,(ulong)uVar6,pcVar10);
    }
    form = L" (Asmjs)\n";
    if ((*(ushort *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 >> 9 & 1) ==
        0) {
      form = L"\n";
    }
    Output::Print(form);
    Output::Flush();
  }
  uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  pFVar11 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar11 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_005f8553;
    *puVar8 = 0;
    pFVar11 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,ObjTypeSpecPhase,uVar6,pFVar11->functionId);
  if (!bVar4) {
    uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
    pFVar11 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar11 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) {
LAB_005f8553:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
      pFVar11 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar4 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015b6718,EquivObjTypeSpecPhase,uVar6,pFVar11->functionId);
    if (!bVar4) {
      return;
    }
  }
  pFVar12 = Js::CodeGenRecyclableData::JitTimeData(workItem->recyclableData);
  if ((pFVar12->inlineCacheStats).ptr == (FieldAccessStats *)0x0) {
    iVar5 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
    pcVar9 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_98);
    Output::Print(L"EquivObjTypeSpec: function %s (%s): inline cache stats unavailable\n",
                  CONCAT44(extraout_var_02,iVar5),pcVar9);
  }
  else {
    pFVar12 = Js::CodeGenRecyclableData::JitTimeData(workItem->recyclableData);
    pFVar2 = (pFVar12->inlineCacheStats).ptr;
    Memory::Recycler::WBSetBit((char *)(debugStringBuffer + 0x28));
    unique0x10000802 = pFVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(debugStringBuffer + 0x28);
    iVar5 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
    pcVar9 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_98);
    Output::Print(L"ObjTypeSpec: jitting function %s (#%s): inline cache stats:\n",
                  CONCAT44(extraout_var_01,iVar5),pcVar9);
    Output::Print(L"    overall: total %u, no profile info %u\n",
                  (ulong)stack0xffffffffffffffc0->totalInlineCacheCount,
                  (ulong)stack0xffffffffffffffc0->noInfoInlineCacheCount);
    Output::Print(L"    mono: total %u, empty %u, cloned %u\n",
                  (ulong)stack0xffffffffffffffc0->monoInlineCacheCount,
                  (ulong)stack0xffffffffffffffc0->emptyMonoInlineCacheCount,
                  (ulong)stack0xffffffffffffffc0->clonedMonoInlineCacheCount);
    Output::Print(L"    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"
                  ,(ulong)stack0xffffffffffffffc0->polyInlineCacheCount,
                  (ulong)stack0xffffffffffffffc0->highUtilPolyInlineCacheCount,
                  (ulong)stack0xffffffffffffffc0->lowUtilPolyInlineCacheCount,
                  (ulong)stack0xffffffffffffffc0->nullPolyInlineCacheCount,
                  (ulong)stack0xffffffffffffffc0->emptyPolyInlineCacheCount,
                  (ulong)stack0xffffffffffffffc0->ignoredPolyInlineCacheCount,
                  (ulong)stack0xffffffffffffffc0->disabledPolyInlineCacheCount,
                  (ulong)stack0xffffffffffffffc0->equivPolyInlineCacheCount,
                  (ulong)stack0xffffffffffffffc0->nonEquivPolyInlineCacheCount,
                  (ulong)stack0xffffffffffffffc0->clonedPolyInlineCacheCount);
  }
  Output::Flush();
  return;
}

Assistant:

void NativeCodeGenerator::LogCodeGenStart(CodeGenWorkItem * workItem, LARGE_INTEGER * start_time)
{
    Js::FunctionBody * body = workItem->GetFunctionBody();
    {
        if (IS_JS_ETW(EventEnabledJSCRIPT_FUNCTION_JIT_START()))
        {
            WCHAR displayNameBuffer[256];
            WCHAR* displayName = displayNameBuffer;
            size_t sizeInChars = workItem->GetDisplayName(displayName, 256);
            if (sizeInChars > 256)
            {
                displayName = HeapNewArray(WCHAR, sizeInChars);
                workItem->GetDisplayName(displayName, 256);
            }
            JS_ETW(EventWriteJSCRIPT_FUNCTION_JIT_START(
                body->GetFunctionNumber(),
                displayName,
                body->GetScriptContext(),
                workItem->GetInterpretedCount(),
                (const unsigned int)body->LengthInBytes(),
                body->GetByteCodeCount(),
                body->GetByteCodeInLoopCount(),
                (int)workItem->GetJitMode()));

            if (displayName != displayNameBuffer)
            {
                HeapDeleteArray(sizeInChars, displayName);
            }
        }
    }

#if DBG_DUMP
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::BackEndPhase))
    {
        if (workItem->GetEntryPoint()->IsLoopBody())
        {
            Output::Print(_u("---BeginBackEnd: function: %s, loop:%d---\r\n"), body->GetDisplayName(), ((JsLoopBodyCodeGen*)workItem)->GetLoopNumber());
        }
        else
        {
            Output::Print(_u("---BeginBackEnd: function: %s---\r\n"), body->GetDisplayName());
        }
        Output::Flush();
    }
#endif

    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

    if (PHASE_TRACE(Js::BackEndPhase, body))
    {
        QueryPerformanceCounter(start_time);
        if (workItem->GetEntryPoint()->IsLoopBody())
        {
            Output::Print(
                _u("BeginBackEnd - function: %s (%s, line %u), loop: %u, mode: %S"),
                body->GetDisplayName(),
                body->GetDebugNumberSet(debugStringBuffer),
                body->GetLineNumber(),
                ((JsLoopBodyCodeGen*)workItem)->GetLoopNumber(),
                ExecutionModeName(workItem->GetJitMode()));
            if (body->GetIsAsmjsMode())
            {
                Output::Print(_u(" (Asmjs)\n"));
            }
            else
            {
                Output::Print(_u("\n"));
            }
        }
        else
        {
            Output::Print(
                _u("BeginBackEnd - function: %s (%s, line %u), mode: %S"),
                body->GetDisplayName(),
                body->GetDebugNumberSet(debugStringBuffer),
                body->GetLineNumber(),
                ExecutionModeName(workItem->GetJitMode()));

            if (body->GetIsAsmjsMode())
            {
                Output::Print(_u(" (Asmjs)\n"));
            }
            else
            {
                Output::Print(_u("\n"));
            }
        }
        Output::Flush();
    }

#ifdef FIELD_ACCESS_STATS
    if (PHASE_TRACE(Js::ObjTypeSpecPhase, body) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, body))
    {
        if (workItem->RecyclableData()->JitTimeData()->inlineCacheStats)
        {
            auto stats = workItem->RecyclableData()->JitTimeData()->inlineCacheStats;
            Output::Print(_u("ObjTypeSpec: jitting function %s (#%s): inline cache stats:\n"), body->GetDisplayName(), body->GetDebugNumberSet(debugStringBuffer));
            Output::Print(_u("    overall: total %u, no profile info %u\n"), stats->totalInlineCacheCount, stats->noInfoInlineCacheCount);
            Output::Print(_u("    mono: total %u, empty %u, cloned %u\n"),
                stats->monoInlineCacheCount, stats->emptyMonoInlineCacheCount, stats->clonedMonoInlineCacheCount);
            Output::Print(_u("    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"),
                stats->polyInlineCacheCount, stats->highUtilPolyInlineCacheCount, stats->lowUtilPolyInlineCacheCount,
                stats->nullPolyInlineCacheCount, stats->emptyPolyInlineCacheCount, stats->ignoredPolyInlineCacheCount, stats->disabledPolyInlineCacheCount,
                stats->equivPolyInlineCacheCount, stats->nonEquivPolyInlineCacheCount, stats->clonedPolyInlineCacheCount);
        }
        else
        {
            Output::Print(_u("EquivObjTypeSpec: function %s (%s): inline cache stats unavailable\n"), body->GetDisplayName(), body->GetDebugNumberSet(debugStringBuffer));
        }
        Output::Flush();
    }
#endif
}